

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread-priority.c
# Opt level: O0

int run_test_thread_priority(void)

{
  int iVar1;
  int iVar2;
  pthread_t pVar3;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_thread_t task_id;
  int local_20;
  sched_param param;
  int policy;
  int max;
  int min;
  int priority;
  
  iVar1 = uv_thread_getpriority(0,(int *)0x0);
  if ((long)iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-priority.c"
            ,0x3a,"UV_EINVAL","==","uv_thread_getpriority(0, ((void*)0))",0xffffffffffffffea,"==",
            (long)iVar1);
    abort();
  }
  iVar1 = uv_sem_init(&sem,1);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-priority.c"
            ,0x3b,"uv_sem_init(&sem, 1)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_sem_wait(&sem);
  iVar1 = uv_thread_create((uv_thread_t *)&eval_a,simple_task,(void *)0x0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-priority.c"
            ,0x3d,"uv_thread_create(&task_id, simple_task, ((void*)0))","==","0",(long)iVar1,"==",0)
    ;
    abort();
  }
  iVar1 = uv_thread_getpriority(eval_a,&max);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-priority.c"
            ,0x3e,"uv_thread_getpriority(task_id, &priority)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = pthread_getschedparam(eval_a,&local_20,(sched_param *)((long)&task_id + 4));
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-priority.c"
            ,0x43,"pthread_getschedparam(task_id, &policy, &param)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = sched_get_priority_min(local_20);
  param.sched_priority = sched_get_priority_max(local_20);
  if ((max < iVar1) || (param.sched_priority < max)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-priority.c"
            ,0x4b,"priority >= min && priority <= max");
    abort();
  }
  iVar2 = uv_thread_setpriority(eval_a,-2);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-priority.c"
            ,0x4e,"uv_thread_setpriority(task_id, UV_THREAD_PRIORITY_LOWEST)","==","0",(long)iVar2,
            "==",0);
    abort();
  }
  iVar2 = uv_thread_getpriority(eval_a,&max);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-priority.c"
            ,0x4f,"uv_thread_getpriority(task_id, &priority)","==","0",(long)iVar2,"==",0);
    abort();
  }
  if ((long)max != (long)iVar1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-priority.c"
            ,0x54,"priority","==","min",(long)max,"==",(long)iVar1);
    abort();
  }
  pVar3 = pthread_self();
  iVar1 = uv_thread_getpriority(pVar3,&max);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-priority.c"
            ,0x5b,"uv_thread_getpriority(pthread_self(), &priority)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)max != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-priority.c"
            ,0x5c,"priority","==","0",(long)max,"==",0);
    abort();
  }
  pVar3 = pthread_self();
  iVar1 = uv_thread_setpriority(pVar3,-2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-priority.c"
            ,0x5d,"uv_thread_setpriority(pthread_self(), UV_THREAD_PRIORITY_LOWEST)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  pVar3 = pthread_self();
  iVar1 = uv_thread_getpriority(pVar3,&max);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-priority.c"
            ,0x5e,"uv_thread_getpriority(pthread_self(), &priority)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)max != 4) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-priority.c"
            ,0x5f,"priority","==","(0 - UV_THREAD_PRIORITY_LOWEST * 2)",(long)max,"==",4);
    abort();
  }
  uv_sem_post(&sem);
  iVar1 = uv_thread_join((uv_thread_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-priority.c"
            ,100,"uv_thread_join(&task_id)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_sem_destroy(&sem);
  return 0;
}

Assistant:

TEST_IMPL(thread_priority) {
  int priority;
#ifndef _WIN32
  int min;
  int max;
  int policy;
  struct sched_param param;
#endif
  uv_thread_t task_id;

  /* Verify that passing a NULL pointer returns UV_EINVAL. */
  ASSERT_EQ(UV_EINVAL, uv_thread_getpriority(0, NULL));
  ASSERT_OK(uv_sem_init(&sem, 1));
  uv_sem_wait(&sem);
  ASSERT_OK(uv_thread_create(&task_id, simple_task, NULL));
  ASSERT_OK(uv_thread_getpriority(task_id, &priority));

#ifdef _WIN32
  ASSERT_EQ(priority, THREAD_PRIORITY_NORMAL);
#else
  ASSERT_OK(pthread_getschedparam(task_id, &policy, &param));
#ifdef __PASE__
  min = 1;
  max = 127;
#else
  min = sched_get_priority_min(policy);
  max = sched_get_priority_max(policy);
#endif
  ASSERT(priority >= min && priority <= max);
#endif

  ASSERT_OK(uv_thread_setpriority(task_id, UV_THREAD_PRIORITY_LOWEST));
  ASSERT_OK(uv_thread_getpriority(task_id, &priority));

#ifdef _WIN32
  ASSERT_EQ(priority, THREAD_PRIORITY_LOWEST);
#else
  ASSERT_EQ(priority, min);
#endif

/**
 * test set nice value for the calling thread with default schedule policy
*/
#ifdef __linux__
  ASSERT_OK(uv_thread_getpriority(pthread_self(), &priority));
  ASSERT_EQ(priority, 0);
  ASSERT_OK(uv_thread_setpriority(pthread_self(), UV_THREAD_PRIORITY_LOWEST));
  ASSERT_OK(uv_thread_getpriority(pthread_self(), &priority));
  ASSERT_EQ(priority, (0 - UV_THREAD_PRIORITY_LOWEST * 2));
#endif

  uv_sem_post(&sem);

  ASSERT_OK(uv_thread_join(&task_id));

  uv_sem_destroy(&sem);

  return 0;
}